

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

appender fmt::v8::detail::write_int_noinline<char,fmt::v8::appender,unsigned__int128>
                   (appender out,write_int_arg<unsigned___int128> arg,
                   basic_format_specs<char> *specs,locale_ref loc)

{
  presentation_type pVar1;
  ulong uVar2;
  ulong uVar3;
  undefined1 value [16];
  undefined1 n [16];
  undefined1 value_00 [16];
  int iVar4;
  int iVar5;
  char *digits;
  appender aVar6;
  long lVar7;
  byte *pbVar8;
  ulong uVar9;
  char *pcVar10;
  uint uVar11;
  char *digits_1;
  char *pcVar12;
  char *pcVar13;
  uint uVar14;
  detail *pdVar15;
  long lVar16;
  long lVar17;
  ulong uVar18;
  appender it;
  bool bVar19;
  bool bVar20;
  format_decimal_result<char_*> fVar21;
  undefined1 local_c8 [8];
  char buffer [39];
  back_insert_iterator<fmt::v8::detail::buffer<char>_> local_38;
  
  pVar1 = specs->type;
  local_38 = out.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.container;
  switch(pVar1) {
  case none:
  case dec:
    break;
  case oct:
    uVar18 = 0;
    iVar5 = 0;
    uVar9 = arg.abs_value._8_8_;
    pdVar15 = (detail *)arg.abs_value;
    do {
      iVar5 = iVar5 + 1;
      uVar2 = uVar9 << 0x3d;
      uVar18 = uVar18 - 1;
      bVar19 = (detail *)0x7 < pdVar15;
      bVar20 = uVar9 != 0;
      uVar3 = -uVar9;
      uVar9 = uVar9 >> 3;
      pdVar15 = (detail *)(uVar2 | (ulong)pdVar15 >> 3);
    } while (bVar20 || uVar3 < bVar19);
    if (((char)*(ushort *)&specs->field_0x9 < '\0') &&
       (((detail *)arg.abs_value != (detail *)0x0 || arg.abs_value._8_8_ != 0) &&
        specs->precision <= iVar5)) {
      uVar14 = 0x3000;
      if (arg.prefix == 0) {
        uVar14 = 0x30;
      }
      arg.prefix = (uVar14 | arg.prefix) + 0x1000000;
    }
    uVar14 = specs->width;
    iVar4 = specs->precision;
    if (iVar4 == -1 && uVar14 == 0) {
      if ((arg.prefix != 0) && (uVar14 = arg.prefix & 0xffffff, (arg.prefix & 0xffffff) != 0)) {
        do {
          if (*(ulong *)((long)out.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.
                               container + 0x18) <
              *(long *)((long)out.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.
                              container + 0x10) + 1U) {
            (*(code *)**(undefined8 **)
                        out.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.container)
                      (out.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.container);
          }
          lVar16 = *(long *)((long)out.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.
                                   container + 0x10);
          *(long *)((long)out.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.container +
                   0x10) = lVar16 + 1;
          *(char *)(*(long *)((long)out.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.
                                    container + 8) + lVar16) = (char)uVar14;
          bVar19 = 0xff < uVar14;
          uVar14 = uVar14 >> 8;
        } while (bVar19);
      }
      lVar16 = *(long *)((long)out.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.
                               container + 0x10);
      uVar9 = lVar16 - uVar18;
      if (*(ulong *)((long)out.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.container
                    + 0x18) < uVar9) {
        lVar16 = 0;
      }
      else {
        *(ulong *)((long)out.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.container +
                  0x10) = uVar9;
        lVar16 = lVar16 + *(long *)((long)out.
                                          super_back_insert_iterator<fmt::v8::detail::buffer<char>_>
                                          .container + 8);
      }
      if (lVar16 != 0) {
        pbVar8 = (byte *)(~uVar18 + lVar16);
        do {
          uVar9 = arg.abs_value._8_8_ << 0x3d;
          *pbVar8 = (byte)(detail *)arg.abs_value & 7 | 0x30;
          pbVar8 = pbVar8 + -1;
          bVar19 = ((detail *)arg.abs_value < (detail *)0x8) <= arg.abs_value._8_8_;
          arg.abs_value._8_8_ = arg.abs_value._8_8_ >> 3;
          arg.abs_value._0_8_ = (detail *)(uVar9 | (ulong)(detail *)arg.abs_value >> 3);
        } while (bVar19);
        return (appender)
               out.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.container.container;
      }
      pbVar8 = local_c8 + ~uVar18;
      pcVar10 = local_c8 + -uVar18;
      do {
        *pbVar8 = (byte)(detail *)arg.abs_value & 7 | 0x30;
        uVar9 = arg.abs_value._8_8_ << 0x3d;
        pbVar8 = pbVar8 + -1;
        bVar19 = (detail *)0x7 < (detail *)arg.abs_value;
        bVar20 = arg.abs_value._8_8_ != 0;
        uVar18 = -arg.abs_value._8_8_;
        arg.abs_value._8_8_ = arg.abs_value._8_8_ >> 3;
        arg.abs_value._0_8_ = (detail *)(uVar9 | (ulong)(detail *)arg.abs_value >> 3);
      } while (bVar20 || uVar18 < bVar19);
      goto LAB_0012a449;
    }
    uVar11 = (arg.prefix >> 0x18) + iVar5;
    buffer._0_8_ = ZEXT48(uVar11);
    if ((*(ushort *)&specs->field_0x9 & 0xf) == 4) {
      if (uVar11 < uVar14) {
        buffer._8_8_ = (ulong)uVar14 - buffer._0_8_;
        buffer._0_8_ = (ulong)uVar14;
        goto LAB_0012a2cc;
      }
    }
    else {
      buffer._8_8_ = ZEXT48((uint)(iVar4 - iVar5));
      if (iVar4 - iVar5 != 0 && iVar5 <= iVar4) {
        buffer._0_8_ = ZEXT48(iVar4 + (arg.prefix >> 0x18));
        goto LAB_0012a2cc;
      }
    }
    buffer._8_8_ = 0;
LAB_0012a2cc:
    buffer._24_8_ = (detail *)arg.abs_value;
    stack0xffffffffffffff60 = arg.abs_value._8_8_;
    local_c8._0_4_ = arg.prefix;
    aVar6 = write_padded<(fmt::v8::align::type)2,fmt::v8::appender,char,fmt::v8::detail::write_int<fmt::v8::appender,char,fmt::v8::detail::write_int<char,fmt::v8::appender,unsigned__int128>(fmt::v8::appender,fmt::v8::detail::write_int_arg<unsigned__int128>,fmt::v8::basic_format_specs<char>const&,fmt::v8::detail::locale_ref)::_lambda(fmt::v8::appender)_4_>(fmt::v8::appender,int,unsigned_int,fmt::v8::basic_format_specs<char>const&,fmt::v8::detail::write_int<char,fmt::v8::appender,unsigned__int128>(fmt::v8::appender,fmt::v8::detail::write_int_arg<unsigned__int128>,fmt::v8::basic_format_specs<char>const&,fmt::v8::detail::locale_ref)::_lambda(fmt::v8::appender)_4_)::_lambda(fmt::v8::appender)_1_&>
                      (out,specs,buffer._0_8_,buffer._0_8_,(anon_class_64_3_4ecd7a16 *)local_c8);
    return (appender)
           aVar6.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.container.container;
  case hex_lower:
  case hex_upper:
    if ((char)*(ushort *)&specs->field_0x9 < '\0') {
      uVar11 = (uint)(pVar1 != hex_upper) << 0xd | 0x5830;
      uVar14 = uVar11 << 8;
      if (arg.prefix == 0) {
        uVar14 = uVar11;
      }
      arg.prefix = (uVar14 | arg.prefix) + 0x2000000;
    }
    uVar9 = arg.abs_value._8_8_;
    pdVar15 = (detail *)arg.abs_value;
    lVar16 = 0;
    do {
      lVar17 = lVar16;
      uVar18 = uVar9 << 0x3c;
      lVar16 = lVar17 + 1;
      bVar19 = (detail *)0xf < pdVar15;
      bVar20 = uVar9 != 0;
      uVar2 = -uVar9;
      uVar9 = uVar9 >> 4;
      pdVar15 = (detail *)(uVar18 | (ulong)pdVar15 >> 4);
    } while (bVar20 || uVar2 < bVar19);
    uVar14 = specs->width;
    iVar5 = specs->precision;
    if (iVar5 == -1 && uVar14 == 0) {
      if ((arg.prefix != 0) && (uVar14 = arg.prefix & 0xffffff, (arg.prefix & 0xffffff) != 0)) {
        do {
          if (*(ulong *)((long)out.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.
                               container + 0x18) <
              *(long *)((long)out.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.
                              container + 0x10) + 1U) {
            (*(code *)**(undefined8 **)
                        out.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.container)
                      (out.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.container);
          }
          lVar7 = *(long *)((long)out.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.
                                  container + 0x10);
          *(long *)((long)out.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.container +
                   0x10) = lVar7 + 1;
          *(char *)(*(long *)((long)out.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.
                                    container + 8) + lVar7) = (char)uVar14;
          bVar19 = 0xff < uVar14;
          uVar14 = uVar14 >> 8;
        } while (bVar19);
      }
      lVar7 = *(long *)((long)out.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.
                              container + 0x10);
      uVar9 = lVar7 + lVar16;
      if (*(ulong *)((long)out.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.container
                    + 0x18) < uVar9) {
        lVar7 = 0;
      }
      else {
        *(ulong *)((long)out.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.container +
                  0x10) = uVar9;
        lVar7 = lVar7 + *(long *)((long)out.
                                        super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.
                                        container + 8);
      }
      if (lVar7 != 0) {
        pcVar10 = "0123456789abcdef";
        if (pVar1 == hex_upper) {
          pcVar10 = "0123456789ABCDEF";
        }
        pcVar12 = (char *)(lVar7 + lVar16);
        do {
          pcVar12 = pcVar12 + -1;
          uVar9 = arg.abs_value._8_8_ << 0x3c;
          *pcVar12 = pcVar10[(uint)(detail *)arg.abs_value & 0xf];
          bVar19 = ((detail *)arg.abs_value < (detail *)0x10) <= arg.abs_value._8_8_;
          arg.abs_value._8_8_ = arg.abs_value._8_8_ >> 4;
          arg.abs_value._0_8_ = (detail *)(uVar9 | (ulong)(detail *)arg.abs_value >> 4);
        } while (bVar19);
        return (appender)
               out.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.container.container;
      }
      pcVar12 = local_c8 + lVar17;
      pcVar10 = local_c8 + lVar17 + 1;
      pcVar13 = "0123456789abcdef";
      if (pVar1 == hex_upper) {
        pcVar13 = "0123456789ABCDEF";
      }
      do {
        *pcVar12 = pcVar13[(uint)(detail *)arg.abs_value & 0xf];
        uVar9 = arg.abs_value._8_8_ << 0x3c;
        pcVar12 = pcVar12 + -1;
        bVar19 = (detail *)0xf < (detail *)arg.abs_value;
        bVar20 = arg.abs_value._8_8_ != 0;
        uVar18 = -arg.abs_value._8_8_;
        arg.abs_value._8_8_ = arg.abs_value._8_8_ >> 4;
        arg.abs_value._0_8_ = (detail *)(uVar9 | (ulong)(detail *)arg.abs_value >> 4);
      } while (bVar20 || uVar18 < bVar19);
      goto LAB_0012a449;
    }
    uVar11 = arg.prefix >> 0x18;
    buffer._0_8_ = (ulong)uVar11 + lVar16;
    if ((*(ushort *)&specs->field_0x9 & 0xf) == 4) {
      if ((uint)buffer._0_8_ < uVar14) {
        buffer._8_8_ = ((ulong)uVar14 - (ulong)uVar11) - lVar16;
        buffer._0_8_ = (ulong)uVar14;
        goto LAB_0012a0ce;
      }
    }
    else if ((int)lVar16 < iVar5) {
      buffer._0_8_ = ZEXT48(uVar11 + iVar5);
      buffer._8_8_ = ZEXT48((uint)(iVar5 - (int)lVar16));
      goto LAB_0012a0ce;
    }
    buffer._8_8_ = 0;
LAB_0012a0ce:
    buffer._24_8_ = (detail *)arg.abs_value;
    stack0xffffffffffffff60 = arg.abs_value._8_8_;
    local_c8._0_4_ = arg.prefix;
    aVar6 = write_padded<(fmt::v8::align::type)2,fmt::v8::appender,char,fmt::v8::detail::write_int<fmt::v8::appender,char,fmt::v8::detail::write_int<char,fmt::v8::appender,unsigned__int128>(fmt::v8::appender,fmt::v8::detail::write_int_arg<unsigned__int128>,fmt::v8::basic_format_specs<char>const&,fmt::v8::detail::locale_ref)::_lambda(fmt::v8::appender)_2_>(fmt::v8::appender,int,unsigned_int,fmt::v8::basic_format_specs<char>const&,fmt::v8::detail::write_int<char,fmt::v8::appender,unsigned__int128>(fmt::v8::appender,fmt::v8::detail::write_int_arg<unsigned__int128>,fmt::v8::basic_format_specs<char>const&,fmt::v8::detail::locale_ref)::_lambda(fmt::v8::appender)_2_)::_lambda(fmt::v8::appender)_1_&>
                      (out,specs,buffer._0_8_,buffer._0_8_,(anon_class_64_3_4ecd7a16 *)local_c8);
    return (appender)
           aVar6.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.container.container;
  case bin_lower:
  case bin_upper:
    if ((char)*(ushort *)&specs->field_0x9 < '\0') {
      uVar11 = (uint)(pVar1 != bin_upper) << 0xd | 0x4230;
      uVar14 = uVar11 << 8;
      if (arg.prefix == 0) {
        uVar14 = uVar11;
      }
      arg.prefix = (uVar14 | arg.prefix) + 0x2000000;
    }
    uVar9 = arg.abs_value._8_8_;
    pdVar15 = (detail *)arg.abs_value;
    lVar16 = 0;
    do {
      lVar17 = lVar16;
      uVar18 = uVar9 << 0x3f;
      lVar16 = lVar17 + 1;
      bVar19 = (detail *)0x1 < pdVar15;
      bVar20 = uVar9 != 0;
      uVar2 = -uVar9;
      uVar9 = uVar9 >> 1;
      pdVar15 = (detail *)(uVar18 | (ulong)pdVar15 >> 1);
    } while (bVar20 || uVar2 < bVar19);
    uVar14 = specs->width;
    iVar5 = specs->precision;
    if (iVar5 == -1 && uVar14 == 0) {
      if ((arg.prefix != 0) && (uVar14 = arg.prefix & 0xffffff, (arg.prefix & 0xffffff) != 0)) {
        do {
          if (*(ulong *)((long)out.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.
                               container + 0x18) <
              *(long *)((long)out.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.
                              container + 0x10) + 1U) {
            (*(code *)**(undefined8 **)
                        out.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.container)
                      (out.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.container);
          }
          lVar7 = *(long *)((long)out.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.
                                  container + 0x10);
          *(long *)((long)out.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.container +
                   0x10) = lVar7 + 1;
          *(char *)(*(long *)((long)out.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.
                                    container + 8) + lVar7) = (char)uVar14;
          bVar19 = 0xff < uVar14;
          uVar14 = uVar14 >> 8;
        } while (bVar19);
      }
      lVar7 = *(long *)((long)out.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.
                              container + 0x10);
      uVar9 = lVar7 + lVar16;
      if (*(ulong *)((long)out.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.container
                    + 0x18) < uVar9) {
        lVar7 = 0;
      }
      else {
        *(ulong *)((long)out.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.container +
                  0x10) = uVar9;
        lVar7 = lVar7 + *(long *)((long)out.
                                        super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.
                                        container + 8);
      }
      if (lVar7 != 0) {
        pbVar8 = (byte *)(lVar7 + lVar16);
        do {
          pbVar8 = pbVar8 + -1;
          uVar9 = arg.abs_value._8_8_ << 0x3f;
          *pbVar8 = (byte)(detail *)arg.abs_value & 1 | 0x30;
          bVar19 = ((detail *)arg.abs_value < (detail *)0x2) <= arg.abs_value._8_8_;
          arg.abs_value._8_8_ = arg.abs_value._8_8_ >> 1;
          arg.abs_value._0_8_ = (detail *)(uVar9 | (ulong)(detail *)arg.abs_value >> 1);
        } while (bVar19);
        return (appender)
               out.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.container.container;
      }
      pbVar8 = local_c8 + lVar17;
      pcVar10 = local_c8 + lVar17 + 1;
      do {
        *pbVar8 = (byte)(detail *)arg.abs_value & 1 | 0x30;
        uVar9 = arg.abs_value._8_8_ << 0x3f;
        pbVar8 = pbVar8 + -1;
        bVar19 = (detail *)0x1 < (detail *)arg.abs_value;
        bVar20 = arg.abs_value._8_8_ != 0;
        uVar18 = -arg.abs_value._8_8_;
        arg.abs_value._8_8_ = arg.abs_value._8_8_ >> 1;
        arg.abs_value._0_8_ = (detail *)(uVar9 | (ulong)(detail *)arg.abs_value >> 1);
      } while (bVar20 || uVar18 < bVar19);
      goto LAB_0012a449;
    }
    uVar11 = arg.prefix >> 0x18;
    buffer._0_8_ = (ulong)uVar11 + lVar16;
    if ((*(ushort *)&specs->field_0x9 & 0xf) == 4) {
      if ((uint)buffer._0_8_ < uVar14) {
        buffer._8_8_ = ((ulong)uVar14 - (ulong)uVar11) - lVar16;
        buffer._0_8_ = (ulong)uVar14;
        goto LAB_0012a08b;
      }
    }
    else if ((int)lVar16 < iVar5) {
      buffer._0_8_ = ZEXT48(uVar11 + iVar5);
      buffer._8_8_ = ZEXT48((uint)(iVar5 - (int)lVar16));
      goto LAB_0012a08b;
    }
    buffer._8_8_ = 0;
LAB_0012a08b:
    buffer._24_8_ = (detail *)arg.abs_value;
    stack0xffffffffffffff60 = arg.abs_value._8_8_;
    local_c8._0_4_ = arg.prefix;
    aVar6 = write_padded<(fmt::v8::align::type)2,fmt::v8::appender,char,fmt::v8::detail::write_int<fmt::v8::appender,char,fmt::v8::detail::write_int<char,fmt::v8::appender,unsigned__int128>(fmt::v8::appender,fmt::v8::detail::write_int_arg<unsigned__int128>,fmt::v8::basic_format_specs<char>const&,fmt::v8::detail::locale_ref)::_lambda(fmt::v8::appender)_3_>(fmt::v8::appender,int,unsigned_int,fmt::v8::basic_format_specs<char>const&,fmt::v8::detail::write_int<char,fmt::v8::appender,unsigned__int128>(fmt::v8::appender,fmt::v8::detail::write_int_arg<unsigned__int128>,fmt::v8::basic_format_specs<char>const&,fmt::v8::detail::locale_ref)::_lambda(fmt::v8::appender)_3_)::_lambda(fmt::v8::appender)_1_&>
                      (out,specs,buffer._0_8_,buffer._0_8_,(anon_class_64_3_4ecd7a16 *)local_c8);
    return (appender)
           aVar6.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.container.container;
  default:
    throw_format_error("invalid type specifier");
  case chr:
    local_c8[0] = (char)arg.abs_value;
    aVar6 = write_padded<(fmt::v8::align::type)1,fmt::v8::appender,char,fmt::v8::detail::write_char<char,fmt::v8::appender>(fmt::v8::appender,char,fmt::v8::basic_format_specs<char>const&)::_lambda(fmt::v8::appender)_1_&>
                      (out,specs,1,1,(anon_class_1_1_a8c68091 *)local_c8);
    return (appender)
           aVar6.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.container.container;
  }
  if (((specs->field_0xa & 1) != 0) &&
     (value._4_4_ = local_c8._4_4_, value._0_4_ = local_c8._0_4_, value._8_8_ = buffer._0_8_,
     bVar19 = write_int_localized<fmt::v8::appender,unsigned__int128,char>
                        ((detail *)&local_38,(appender *)(detail *)arg.abs_value,
                         (unsigned___int128)value,arg.abs_value._8_4_,
                         (basic_format_specs<char> *)(ulong)arg.prefix,(locale_ref)specs), bVar19))
  {
    return (appender)(back_insert_iterator<fmt::v8::detail::buffer<char>_>)local_38.container;
  }
  n._4_4_ = local_c8._4_4_;
  n._0_4_ = local_c8._0_4_;
  n[8] = buffer[0];
  n[9] = buffer[1];
  n[10] = buffer[2];
  n[0xb] = buffer[3];
  n[0xc] = buffer[4];
  n[0xd] = buffer[5];
  n[0xe] = buffer[6];
  n[0xf] = buffer[7];
  iVar4 = count_digits_fallback<unsigned__int128>((detail *)arg.abs_value,(unsigned___int128)n);
  out.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.container = local_38;
  uVar14 = specs->width;
  iVar5 = specs->precision;
  if (iVar5 == -1 && uVar14 == 0) {
    if ((arg.prefix != 0) &&
       (uVar14 = arg.prefix & 0xffffff,
       ((undefined1  [32])arg & (undefined1  [32])0xffffff) != (undefined1  [32])0x0)) {
      do {
        if (*(ulong *)((long)out.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.
                             container + 0x18) <
            *(long *)((long)out.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.container
                     + 0x10) + 1U) {
          (*(code *)**(undefined8 **)
                      out.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.container)
                    (out.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.container);
        }
        lVar16 = *(long *)((long)out.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.
                                 container + 0x10);
        *(long *)((long)out.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.container +
                 0x10) = lVar16 + 1;
        *(char *)(*(long *)((long)out.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.
                                  container + 8) + lVar16) = (char)uVar14;
        bVar19 = 0xff < uVar14;
        uVar14 = uVar14 >> 8;
      } while (bVar19);
    }
    value_00._4_4_ = local_c8._4_4_;
    value_00._0_4_ = local_c8._0_4_;
    value_00[8] = buffer[0];
    value_00[9] = buffer[1];
    value_00[10] = buffer[2];
    value_00[0xb] = buffer[3];
    value_00[0xc] = buffer[4];
    value_00[0xd] = buffer[5];
    value_00[0xe] = buffer[6];
    value_00[0xf] = buffer[7];
    fVar21 = format_decimal<char,unsigned__int128>
                       ((detail *)local_c8,(char *)(detail *)arg.abs_value,
                        (unsigned___int128)value_00,arg.abs_value._8_4_);
    pcVar10 = fVar21.end;
LAB_0012a449:
    aVar6 = copy_str_noinline<char,char*,fmt::v8::appender>(local_c8,pcVar10,out);
    return (appender)
           aVar6.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.container.container;
  }
  uVar11 = (arg.prefix >> 0x18) + iVar4;
  buffer._0_8_ = ZEXT48(uVar11);
  if ((*(ushort *)&specs->field_0x9 & 0xf) == 4) {
    if (uVar11 < uVar14) {
      buffer._8_8_ = (ulong)uVar14 - buffer._0_8_;
      buffer._0_8_ = (ulong)uVar14;
      goto LAB_0012a181;
    }
  }
  else {
    buffer._8_8_ = ZEXT48((uint)(iVar5 - iVar4));
    if (iVar5 - iVar4 != 0 && iVar4 <= iVar5) {
      buffer._0_8_ = ZEXT48(iVar5 + (arg.prefix >> 0x18));
      goto LAB_0012a181;
    }
  }
  buffer._8_8_ = 0;
LAB_0012a181:
  local_c8._0_4_ = arg.prefix;
  buffer._24_8_ = (detail *)arg.abs_value;
  stack0xffffffffffffff60 = arg.abs_value._8_8_;
  aVar6 = write_padded<(fmt::v8::align::type)2,fmt::v8::appender,char,fmt::v8::detail::write_int<fmt::v8::appender,char,fmt::v8::detail::write_int<char,fmt::v8::appender,unsigned__int128>(fmt::v8::appender,fmt::v8::detail::write_int_arg<unsigned__int128>,fmt::v8::basic_format_specs<char>const&,fmt::v8::detail::locale_ref)::_lambda(fmt::v8::appender)_1_>(fmt::v8::appender,int,unsigned_int,fmt::v8::basic_format_specs<char>const&,fmt::v8::detail::write_int<char,fmt::v8::appender,unsigned__int128>(fmt::v8::appender,fmt::v8::detail::write_int_arg<unsigned__int128>,fmt::v8::basic_format_specs<char>const&,fmt::v8::detail::locale_ref)::_lambda(fmt::v8::appender)_1_)::_lambda(fmt::v8::appender)_1_&>
                    ((appender)local_38.container,specs,buffer._0_8_,buffer._0_8_,
                     (anon_class_64_3_4ecd7a16 *)local_c8);
  return (appender)
         aVar6.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.container.container;
}

Assistant:

FMT_CONSTEXPR FMT_NOINLINE auto write_int_noinline(
    OutputIt out, write_int_arg<T> arg, const basic_format_specs<Char>& specs,
    locale_ref loc) -> OutputIt {
  return write_int(out, arg, specs, loc);
}